

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O1

int ArmCpuCaps(char *cpuinfo_name)

{
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  char cpuinfo_line [512];
  long local_238 [65];
  
  __stream = fopen64(cpuinfo_name,"r");
  if (__stream == (FILE *)0x0) {
    iVar2 = 4;
  }
  else {
    pcVar1 = fgets((char *)local_238,0x1ff,__stream);
    if (pcVar1 != (char *)0x0) {
      iVar2 = 4;
      do {
        if (local_238[0] == 0x7365727574616546) {
          pcVar1 = strstr((char *)local_238," neon");
          if ((pcVar1 != (char *)0x0) && ((pcVar1[5] == '\n' || (pcVar1[5] == ' '))))
          goto LAB_0012e24a;
          pcVar1 = strstr((char *)local_238," asimd");
          if (pcVar1 != (char *)0x0) {
            iVar2 = 4;
            goto LAB_0012e24a;
          }
        }
        pcVar1 = fgets((char *)local_238,0x1ff,__stream);
      } while (pcVar1 != (char *)0x0);
    }
    iVar2 = 0;
LAB_0012e24a:
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

LIBYUV_API SAFEBUFFERS int ArmCpuCaps(const char* cpuinfo_name) {
  char cpuinfo_line[512];
  FILE* f = fopen(cpuinfo_name, "r");
  if (!f) {
    // Assume Neon if /proc/cpuinfo is unavailable.
    // This will occur for Chrome sandbox for Pepper or Render process.
    return kCpuHasNEON;
  }
  while (fgets(cpuinfo_line, sizeof(cpuinfo_line) - 1, f)) {
    if (memcmp(cpuinfo_line, "Features", 8) == 0) {
      char* p = strstr(cpuinfo_line, " neon");
      if (p && (p[5] == ' ' || p[5] == '\n')) {
        fclose(f);
        return kCpuHasNEON;
      }
      // aarch64 uses asimd for Neon.
      p = strstr(cpuinfo_line, " asimd");
      if (p) {
        fclose(f);
        return kCpuHasNEON;
      }
    }
  }
  fclose(f);
  return 0;
}